

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_setBasis(void *highs,HighsInt *col_status,HighsInt *row_status)

{
  HighsStatus HVar1;
  HighsInt i;
  size_type sVar2;
  size_type sVar3;
  allocator local_a9;
  string local_a8;
  HighsBasis basis;
  
  HighsBasis::HighsBasis(&basis);
  sVar3 = (size_type)*(int *)((long)highs + 0x138);
  HVar1 = kError;
  if (0 < (long)sVar3) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&basis.col_status,sVar3);
    for (sVar2 = 0; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      if (4 < (uint)col_status[sVar2]) goto LAB_002178ce;
      basis.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[sVar2] = (HighsBasisStatus)col_status[sVar2];
    }
  }
  sVar3 = (size_type)*(int *)((long)highs + 0x13c);
  if (0 < (long)sVar3) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&basis.row_status,sVar3);
    for (sVar2 = 0; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      if (4 < (uint)row_status[sVar2]) goto LAB_002178ce;
      basis.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[sVar2] = (HighsBasisStatus)row_status[sVar2];
    }
  }
  std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
  HVar1 = Highs::setBasis((Highs *)highs,&basis,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
LAB_002178ce:
  HighsBasis::~HighsBasis(&basis);
  return HVar1;
}

Assistant:

HighsInt Highs_setBasis(void* highs, const HighsInt* col_status,
                        const HighsInt* row_status) {
  HighsBasis basis;
  const HighsInt num__col = Highs_getNumCol(highs);
  if (num__col > 0) {
    basis.col_status.resize(num__col);
    for (HighsInt i = 0; i < num__col; i++) {
      if (col_status[i] == (HighsInt)HighsBasisStatus::kLower) {
        basis.col_status[i] = HighsBasisStatus::kLower;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kBasic) {
        basis.col_status[i] = HighsBasisStatus::kBasic;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kUpper) {
        basis.col_status[i] = HighsBasisStatus::kUpper;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kZero) {
        basis.col_status[i] = HighsBasisStatus::kZero;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kNonbasic) {
        basis.col_status[i] = HighsBasisStatus::kNonbasic;
      } else {
        return (HighsInt)HighsStatus::kError;
      }
    }
  }
  const HighsInt num__row = Highs_getNumRow(highs);
  if (num__row > 0) {
    basis.row_status.resize(num__row);
    for (HighsInt i = 0; i < num__row; i++) {
      if (row_status[i] == (HighsInt)HighsBasisStatus::kLower) {
        basis.row_status[i] = HighsBasisStatus::kLower;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kBasic) {
        basis.row_status[i] = HighsBasisStatus::kBasic;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kUpper) {
        basis.row_status[i] = HighsBasisStatus::kUpper;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kZero) {
        basis.row_status[i] = HighsBasisStatus::kZero;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kNonbasic) {
        basis.row_status[i] = HighsBasisStatus::kNonbasic;
      } else {
        return (HighsInt)HighsStatus::kError;
      }
    }
  }
  return (HighsInt)((Highs*)highs)->setBasis(basis);
}